

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVoronoiSimplexSolver.h
# Opt level: O3

bool __thiscall
btVoronoiSimplexSolver::closestPtPointTriangle
          (btVoronoiSimplexSolver *this,btVector3 *p,btVector3 *a,btVector3 *b,btVector3 *c,
          btSubSimplexClosestResult *result)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  byte bVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  btScalar bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  btScalar bVar32;
  float fVar33;
  float fVar34;
  
  bVar10 = *(byte *)&result->m_usedVertices & 0xf0;
  *(byte *)&result->m_usedVertices = bVar10;
  fVar12 = (float)*(undefined8 *)a->m_floats;
  fVar13 = (float)((ulong)*(undefined8 *)a->m_floats >> 0x20);
  fVar18 = (float)*(undefined8 *)b->m_floats;
  fVar19 = (float)((ulong)*(undefined8 *)b->m_floats >> 0x20);
  fVar20 = fVar18 - fVar12;
  fVar21 = fVar19 - fVar13;
  fVar1 = b->m_floats[2];
  fVar2 = a->m_floats[2];
  fVar22 = (float)*(undefined8 *)c->m_floats;
  fVar24 = (float)((ulong)*(undefined8 *)c->m_floats >> 0x20);
  fVar23 = fVar22 - fVar12;
  fVar25 = fVar24 - fVar13;
  fVar3 = c->m_floats[2];
  fVar15 = fVar1 - fVar2;
  fVar16 = fVar3 - fVar2;
  fVar31 = p->m_floats[0];
  fVar28 = p->m_floats[1];
  fVar17 = p->m_floats[2];
  fVar26 = (fVar17 - fVar2) * fVar15 + (fVar31 - fVar12) * fVar20 + (fVar28 - fVar13) * fVar21;
  fVar29 = (fVar17 - fVar2) * fVar16 + (fVar31 - fVar12) * fVar23 + (fVar28 - fVar13) * fVar25;
  auVar8._4_4_ = -(uint)(fVar26 <= 0.0);
  auVar8._0_4_ = -(uint)(fVar26 <= 0.0);
  auVar8._8_4_ = -(uint)(fVar29 <= 0.0);
  auVar8._12_4_ = -(uint)(fVar29 <= 0.0);
  iVar11 = movmskpd((int)p,auVar8);
  if (iVar11 == 3) {
    uVar9 = *(undefined8 *)(a->m_floats + 2);
    *(undefined8 *)(result->m_closestPointOnSimplex).m_floats = *(undefined8 *)a->m_floats;
    *(undefined8 *)((result->m_closestPointOnSimplex).m_floats + 2) = uVar9;
    *(byte *)&result->m_usedVertices = bVar10 | 1;
    bVar27 = 0.0;
    bVar32 = 1.0;
  }
  else {
    fVar33 = (fVar17 - fVar1) * fVar15 + (fVar31 - fVar18) * fVar20 + (fVar28 - fVar19) * fVar21;
    fVar34 = (fVar17 - fVar1) * fVar16 + (fVar31 - fVar18) * fVar23 + (fVar28 - fVar19) * fVar25;
    if ((fVar33 < 0.0) || (fVar33 < fVar34)) {
      fVar14 = fVar26 * fVar34 - fVar29 * fVar33;
      if ((-fVar33 < fVar33) || ((fVar26 < 0.0 || (0.0 < fVar14)))) {
        fVar30 = (fVar17 - fVar3) * fVar15 + fVar20 * (fVar31 - fVar22) + fVar21 * (fVar28 - fVar24)
        ;
        fVar31 = (fVar17 - fVar3) * fVar16 + fVar23 * (fVar31 - fVar22) + fVar25 * (fVar28 - fVar24)
        ;
        if ((fVar31 < 0.0) || (fVar31 < fVar30)) {
          fVar28 = fVar30 * fVar29 - fVar31 * fVar26;
          if (((0.0 < fVar31) || (fVar29 < 0.0)) || (0.0 < fVar28)) {
            fVar17 = fVar33 * fVar31 - fVar34 * fVar30;
            if ((fVar17 <= 0.0) && (fVar34 = fVar34 - fVar33, 0.0 <= fVar34)) {
              bVar32 = 0.0;
              if (0.0 <= fVar30 - fVar31) {
                fVar29 = fVar34 / ((fVar30 - fVar31) + fVar34);
                auVar6._4_4_ = fVar29 * (fVar24 - fVar19) + fVar19;
                auVar6._0_4_ = fVar29 * (fVar22 - fVar18) + fVar18;
                auVar6._8_4_ = (fVar3 - fVar1) * fVar29 + fVar1;
                auVar6._12_4_ = 0;
                *(undefined1 (*) [16])(result->m_closestPointOnSimplex).m_floats = auVar6;
                *(byte *)&result->m_usedVertices = bVar10 | 6;
                bVar27 = 1.0 - fVar29;
                goto LAB_0018190b;
              }
            }
            fVar29 = 1.0 / (fVar17 + fVar28 + fVar14);
            bVar27 = fVar28 * fVar29;
            fVar29 = fVar29 * fVar14;
            auVar7._4_4_ = fVar25 * fVar29 + fVar13 + fVar21 * bVar27;
            auVar7._0_4_ = fVar23 * fVar29 + fVar12 + fVar20 * bVar27;
            auVar7._8_4_ = fVar16 * fVar29 + fVar2 + fVar15 * bVar27;
            auVar7._12_4_ = 0;
            *(undefined1 (*) [16])(result->m_closestPointOnSimplex).m_floats = auVar7;
            *(byte *)&result->m_usedVertices = bVar10 | 7;
            bVar32 = (1.0 - bVar27) - fVar29;
            goto LAB_0018190b;
          }
          fVar29 = fVar29 / (fVar29 - fVar31);
          auVar5._4_4_ = fVar13 + fVar25 * fVar29;
          auVar5._0_4_ = fVar12 + fVar23 * fVar29;
          auVar5._8_4_ = fVar2 + fVar16 * fVar29;
          auVar5._12_4_ = 0;
          *(undefined1 (*) [16])(result->m_closestPointOnSimplex).m_floats = auVar5;
          *(byte *)&result->m_usedVertices = bVar10 | 5;
          bVar32 = 1.0 - fVar29;
        }
        else {
          uVar9 = *(undefined8 *)(c->m_floats + 2);
          *(undefined8 *)(result->m_closestPointOnSimplex).m_floats = *(undefined8 *)c->m_floats;
          *(undefined8 *)((result->m_closestPointOnSimplex).m_floats + 2) = uVar9;
          *(byte *)&result->m_usedVertices = bVar10 | 4;
          fVar29 = 1.0;
          bVar32 = 0.0;
        }
        bVar27 = 0.0;
        goto LAB_0018190b;
      }
      bVar27 = fVar26 / (fVar26 - fVar33);
      auVar4._4_4_ = fVar13 + fVar21 * bVar27;
      auVar4._0_4_ = fVar12 + fVar20 * bVar27;
      auVar4._8_4_ = fVar2 + fVar15 * bVar27;
      auVar4._12_4_ = 0;
      *(undefined1 (*) [16])(result->m_closestPointOnSimplex).m_floats = auVar4;
      *(byte *)&result->m_usedVertices = bVar10 | 3;
      bVar32 = 1.0 - bVar27;
    }
    else {
      uVar9 = *(undefined8 *)(b->m_floats + 2);
      *(undefined8 *)(result->m_closestPointOnSimplex).m_floats = *(undefined8 *)b->m_floats;
      *(undefined8 *)((result->m_closestPointOnSimplex).m_floats + 2) = uVar9;
      *(byte *)&result->m_usedVertices = bVar10 | 2;
      bVar27 = 1.0;
      bVar32 = 0.0;
    }
  }
  fVar29 = 0.0;
LAB_0018190b:
  result->m_barycentricCoords[0] = bVar32;
  result->m_barycentricCoords[1] = bVar27;
  result->m_barycentricCoords[2] = fVar29;
  result->m_barycentricCoords[3] = 0.0;
  return true;
}

Assistant:

void reset()
	{
		usedVertexA = false;
		usedVertexB = false;
		usedVertexC = false;
		usedVertexD = false;
	}